

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O1

CURLcode Curl_rand(Curl_easy *data,uchar *rnd,size_t num)

{
  CURLcode CVar1;
  int __fd;
  undefined8 in_RAX;
  ssize_t sVar2;
  ulong uVar3;
  ulong uVar4;
  curltime cVar5;
  uint r;
  undefined8 local_38;
  
  if (num == 0) {
    return CURLE_BAD_FUNCTION_ARGUMENT;
  }
  local_38 = in_RAX;
  while( true ) {
    uVar4 = 4;
    if (num < 4) {
      uVar4 = num;
    }
    CVar1 = Curl_ssl_random(data,(uchar *)&local_38,4);
    if (CVar1 == CURLE_NOT_BUILT_IN) {
      if ((randit_seeded == '\0') && (__fd = open64("/dev/urandom",0), -1 < __fd)) {
        sVar2 = read(__fd,&randit_randseed,4);
        if (sVar2 == 4) {
          randit_seeded = '\x01';
        }
        close(__fd);
      }
      if (randit_seeded == '\0') {
        cVar5 = Curl_now();
        Curl_infof(data,"WARNING: Using weak random seed\n");
        randit_randseed =
             ((int)cVar5.tv_sec + cVar5.tv_usec + randit_randseed) * -0x7f82434b + 0xa70427df;
        randit_seeded = '\x01';
      }
      randit_randseed = randit_randseed * 0x41c64e6d + 0x3039;
      local_38 = CONCAT44(local_38._4_4_,randit_randseed * 0x10000 | randit_randseed >> 0x10);
      CVar1 = CURLE_OK;
    }
    uVar3 = uVar4;
    if (CVar1 == CURLE_OK) {
      do {
        *rnd = (uchar)local_38;
        local_38 = CONCAT44(local_38._4_4_,(uint)local_38 >> 8);
        rnd = rnd + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      num = num - uVar4;
    }
    else {
      local_38 = CONCAT44(CVar1,(uint)local_38);
    }
    if (CVar1 != CURLE_OK) break;
    if (num == 0) {
      return CURLE_OK;
    }
  }
  return local_38._4_4_;
}

Assistant:

CURLcode Curl_rand(struct Curl_easy *data, unsigned char *rnd, size_t num)
{
  CURLcode result = CURLE_BAD_FUNCTION_ARGUMENT;

  DEBUGASSERT(num > 0);

  while(num) {
    unsigned int r;
    size_t left = num < sizeof(unsigned int) ? num : sizeof(unsigned int);

    result = randit(data, &r);
    if(result)
      return result;

    while(left) {
      *rnd++ = (unsigned char)(r & 0xFF);
      r >>= 8;
      --num;
      --left;
    }
  }

  return result;
}